

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::FileTimeGet(string *fname,cmSystemToolsFileTime *t)

{
  int iVar1;
  char *__file;
  undefined1 local_b0 [8];
  stat st;
  cmSystemToolsFileTime *t_local;
  string *fname_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)t;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_b0);
  if (-1 < iVar1) {
    *(__blkcnt_t *)st.__glibc_reserved[2] = st.st_blocks;
    *(__syscall_slong_t *)(st.__glibc_reserved[2] + 8) = st.st_atim.tv_nsec;
  }
  return -1 < iVar1;
}

Assistant:

bool cmSystemTools::FileTimeGet(const std::string& fname,
                                cmSystemToolsFileTime* t)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  cmSystemToolsWindowsHandle h = CreateFileW(
    SystemTools::ConvertToWindowsExtendedPath(fname).c_str(), GENERIC_READ,
    FILE_SHARE_READ, 0, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0);
  if (!h) {
    return false;
  }
  if (!GetFileTime(h, &t->timeCreation, &t->timeLastAccess,
                   &t->timeLastWrite)) {
    return false;
  }
#else
  struct stat st;
  if (stat(fname.c_str(), &st) < 0) {
    return false;
  }
  t->timeBuf.actime = st.st_atime;
  t->timeBuf.modtime = st.st_mtime;
#endif
  return true;
}